

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::PatchGetRootValue<false,Js::InlineCache>
              (FunctionBody *functionBody,InlineCache *inlineCache,InlineCacheIndex inlineCacheIndex
              ,DynamicObject *object,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionBody *local_88;
  Var value;
  PropertyValueInfo info;
  ScriptContext *scriptContext;
  PropertyId propertyId_local;
  DynamicObject *object_local;
  InlineCacheIndex inlineCacheIndex_local;
  InlineCache *inlineCache_local;
  FunctionBody *functionBody_local;
  
  bVar2 = VarIs<Js::RootObjectBase,Js::DynamicObject>(object);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1f9a,"(VarIs<RootObjectBase>(object))",
                                "Root must be a global object!");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  info._56_8_ = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&value);
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)&value,functionBody,inlineCache,inlineCacheIndex,true);
  bVar2 = CacheOperators::TryGetProperty<true,true,true,false,true,false,true,false,false,false>
                    (object,true,&object->super_RecyclableObject,propertyId,&local_88,
                     (ScriptContext *)info._56_8_,(PropertyCacheOperationInfo *)0x0,
                     (PropertyValueInfo *)&value);
  if (bVar2) {
    functionBody_local = local_88;
  }
  else {
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01ec1678,InlineCachePhase);
    if ((bVar2) && ((DAT_01ec73ca & 1) != 0)) {
      CacheOperators::TraceCache
                (inlineCache,L"PatchGetRootValue",propertyId,(ScriptContext *)info._56_8_,
                 &object->super_RecyclableObject);
    }
    functionBody_local =
         (FunctionBody *)
         OP_GetRootProperty(object,propertyId,(PropertyValueInfo *)&value,
                            (ScriptContext *)info._56_8_);
  }
  return functionBody_local;
}

Assistant:

inline Var JavascriptOperators::PatchGetRootValue(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, DynamicObject * object, PropertyId propertyId)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchGetRootValue);
        AssertMsg(VarIs<RootObjectBase>(object), "Root must be a global object!");

        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        Var value;
        if (CacheOperators::TryGetProperty<true, true, true, false, true, false, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false, false>(
                object, true, object, propertyId, &value, scriptContext, nullptr, &info))
        {
            return value;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchGetRootValue"), propertyId, scriptContext, object);
        }
#endif

        return JavascriptOperators::OP_GetRootProperty(object, propertyId, &info, scriptContext);
        JIT_HELPER_END(Op_PatchGetRootValue);
    }